

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlist.c
# Opt level: O2

dlist_t * dlist_new(void *data)

{
  dlist_t *pdVar1;
  
  pdVar1 = (dlist_t *)malloc(0x18);
  if (pdVar1 != (dlist_t *)0x0) {
    pdVar1->next = (dlist_s *)0x0;
    pdVar1->prev = (dlist_s *)0x0;
    pdVar1->data = data;
  }
  return pdVar1;
}

Assistant:

dlist_t *dlist_new(void *data) {
  dlist_t *dlist = malloc(sizeof(dlist_t));
  
  if (dlist) {
    dlist->next = NULL;
    dlist->prev = NULL;
    dlist->data = data;
  }
  
  return dlist;
}